

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EdgeControlSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EdgeControlSpecifierSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *args_1,Token *args_2)

{
  Token closeBracket;
  Token openBracket;
  EdgeControlSpecifierSyntax *this_00;
  
  this_00 = (EdgeControlSpecifierSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EdgeControlSpecifierSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EdgeControlSpecifierSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openBracket.kind = args->kind;
  openBracket._2_1_ = args->field_0x2;
  openBracket.numFlags.raw = (args->numFlags).raw;
  openBracket.rawLen = args->rawLen;
  openBracket.info = args->info;
  closeBracket.kind = args_2->kind;
  closeBracket._2_1_ = args_2->field_0x2;
  closeBracket.numFlags.raw = (args_2->numFlags).raw;
  closeBracket.rawLen = args_2->rawLen;
  closeBracket.info = args_2->info;
  slang::syntax::EdgeControlSpecifierSyntax::EdgeControlSpecifierSyntax
            (this_00,openBracket,args_1,closeBracket);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }